

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_request_private.c
# Opt level: O3

void nhr_request_send_raw_request(nhr_request r)

{
  nhr_bool nVar1;
  char *data;
  int iVar2;
  size_t header_size;
  size_t local_20;
  
  local_20 = 0;
  if (r->method == nhr_method_POST) {
    data = nhr_request_create_header_POST(r,&local_20);
  }
  else {
    if (r->method != nhr_method_GET) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/OlehKulykov[P]libnhr/src/nhr_request_private.c"
                    ,0x8c,"void nhr_request_send_raw_request(nhr_request)");
    }
    data = nhr_request_create_header_GET(r,&local_20);
  }
  nVar1 = nhr_request_send_buffer(r,data,local_20);
  iVar2 = 3;
  if (nVar1 == '\0') {
    if (r->socket != -1) {
      close(r->socket);
      r->socket = -1;
    }
    nVar1 = nhr_request_check_timeout(r);
    if (nVar1 == '\0') goto LAB_00104bcb;
    r->error_code = nhr_error_code_failed_connect_to_host;
    iVar2 = 6;
  }
  nhr_mutex_lock(r->command_mutex);
  r->command = iVar2;
  nhr_mutex_unlock(r->command_mutex);
LAB_00104bcb:
  nhr_free(data);
  return;
}

Assistant:

void nhr_request_send_raw_request(nhr_request r) {
	char * header = NULL;
	size_t header_size = 0;
	switch (r->method) {
#if !defined(NHR_NO_GET)
		case nhr_method_GET: header = nhr_request_create_header_GET(r, &header_size); break;
#endif

#if !defined(NHR_NO_POST)
		case nhr_method_POST: header = nhr_request_create_header_POST(r, &header_size); break;
#endif

		default:
			assert(0); //TODO: unsupported method
			break;
	}

	if (nhr_request_send_buffer(r, header, header_size)) {
		nhr_request_set_command(r, NHR_COMMAND_START_WAITING_RAW_RESPONSE);
	} else {
		nhr_request_close(r);
		if (nhr_request_check_timeout(r)) {
			r->error_code = nhr_error_code_failed_connect_to_host;
			nhr_request_set_command(r, NHR_COMMAND_INFORM_ERROR);
		}
	}
	nhr_free(header);
}